

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O1

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::UniqueNameGenerator
          (UniqueNameGenerator *this,char *template_name)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,template_name,&local_11);
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->separator_,"_","");
  return;
}

Assistant:

UniqueNameGenerator::UniqueNameGenerator(const char *template_name) :
    template_name_(template_name),
    separator_("_") {
}